

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs2.c
# Opt level: O2

int Wlc_NtkNodeDeref_rec(Wlc_Ntk_t *p,Wlc_Obj_t *pNode,Vec_Bit_t *vUnmark)

{
  int iVar1;
  int iVar2;
  long lVar3;
  Wlc_Obj_t *pNode_00;
  int iVar4;
  int i;
  
  iVar4 = 0;
  if ((undefined1  [24])((undefined1  [24])*pNode & (undefined1  [24])0x3d) != (undefined1  [24])0x1
     ) {
    lVar3 = (long)pNode - (long)p->pObjs;
    Vec_BitWriteEntry(vUnmark,(int)(lVar3 / 0x18),(int)(lVar3 % 0x18));
    iVar4 = 1;
    for (i = 0; i < (int)pNode->nFanins; i = i + 1) {
      iVar1 = Wlc_ObjFaninId(pNode,i);
      Vec_IntAddToEntry(&p->vRefs,iVar1,-1);
      iVar2 = Vec_IntEntry(&p->vRefs,iVar1);
      if (iVar2 == 0) {
        pNode_00 = Wlc_NtkObj(p,iVar1);
        iVar1 = Wlc_NtkNodeDeref_rec(p,pNode_00,vUnmark);
        iVar4 = iVar4 + iVar1;
      }
    }
  }
  return iVar4;
}

Assistant:

static int Wlc_NtkNodeDeref_rec( Wlc_Ntk_t * p, Wlc_Obj_t * pNode, Vec_Bit_t * vUnmark )
{
    int i, Fanin, Counter = 1;
    if ( Wlc_ObjIsCi(pNode) )
        return 0;
    Vec_BitWriteEntry( vUnmark, Wlc_ObjId(p, pNode), 1 );
    Wlc_ObjForEachFanin( pNode, Fanin, i )
    {
        Vec_IntAddToEntry( &p->vRefs, Fanin, -1 );
        if ( Vec_IntEntry(&p->vRefs, Fanin) == 0 )
            Counter += Wlc_NtkNodeDeref_rec( p, Wlc_NtkObj(p, Fanin), vUnmark );
    }
    return Counter;
}